

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall
c4::yml::NodeScalar::set_ref_maybe_replacing_scalar(NodeScalar *this,csubstr ref,bool has_scalar)

{
  ro_substr pattern;
  undefined1 uVar1;
  bool bVar2;
  error_flags eVar3;
  byte in_CL;
  size_t in_RDX;
  char *in_RSI;
  size_t in_RDI;
  csubstr trimmed;
  undefined7 in_stack_ffffffffffffff88;
  basic_substring<const_char> *in_stack_ffffffffffffff90;
  char *local_60;
  size_t local_58;
  basic_substring<const_char> local_40;
  char *local_30;
  undefined4 local_28;
  undefined8 local_20;
  basic_substring<const_char> *local_18;
  char *local_10;
  size_t local_8;
  
  local_40.str = in_RSI;
  local_40.len = in_RDX;
  uVar1 = basic_substring<const_char>::begins_with(&local_40,'*');
  if ((bool)uVar1) {
    local_18 = &local_40;
    local_20 = 1;
    if (local_40.len == 0) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      local_30 = 
      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
      ;
      local_28 = 0x1533;
      handle_error(0x347f4b,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (in_stack_ffffffffffffff90,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff88),in_RDI);
    local_60 = local_10;
    local_58 = local_8;
  }
  else {
    local_60 = local_40.str;
    local_58 = local_40.len;
  }
  *(char **)(in_RDI + 0x20) = local_60;
  *(size_t *)(in_RDI + 0x28) = local_58;
  if (((in_CL & 1) == 0) ||
     (pattern.len = local_58, pattern.str = local_60,
     bVar2 = basic_substring<const_char>::ends_with
                       ((basic_substring<const_char> *)CONCAT17(uVar1,in_stack_ffffffffffffff88),
                        pattern), !bVar2)) {
    *(char **)(in_RDI + 0x10) = local_40.str;
    *(size_t *)(in_RDI + 0x18) = local_40.len;
  }
  return;
}

Assistant:

void set_ref_maybe_replacing_scalar(csubstr ref, bool has_scalar) noexcept
    {
        csubstr trimmed = ref.begins_with('*') ? ref.sub(1) : ref;
        anchor = trimmed;
        if((!has_scalar) || !scalar.ends_with(trimmed))
            scalar = ref;
    }